

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xrep.c
# Opt level: O1

void xrep0_pipe_recv_cb(void *arg)

{
  nni_aio *aio;
  byte bVar1;
  long lVar2;
  nng_err nVar3;
  int iVar4;
  uint32_t uVar5;
  int iVar6;
  nni_msg *m;
  size_t sVar7;
  byte *data;
  byte bVar8;
  int iVar9;
  
  lVar2 = *(long *)((long)arg + 8);
  aio = (nni_aio *)((long)arg + 0x3a8);
  nVar3 = nni_aio_result(aio);
  if (nVar3 != NNG_OK) {
    nni_pipe_close(*arg);
    return;
  }
  iVar4 = nni_atomic_get((nni_atomic_int *)(lVar2 + 0x38));
  m = nni_aio_get_msg(aio);
  nni_aio_set_msg(aio,(nni_msg *)0x0);
  uVar5 = nni_pipe_id(*arg);
  nni_msg_set_pipe(m,uVar5);
  uVar5 = nni_pipe_id(*arg);
  nni_msg_header_append_u32(m,uVar5);
  iVar9 = 1;
  do {
    bVar8 = 4;
    if (iVar9 <= iVar4) {
      iVar9 = iVar9 + 1;
      sVar7 = nni_msg_len(m);
      if (sVar7 < 4) {
        nni_msg_free(m);
        nni_pipe_close(*arg);
        bVar8 = 1;
      }
      else {
        data = (byte *)nni_msg_body(m);
        bVar1 = *data;
        iVar6 = nni_msg_header_append(m,data,4);
        if (iVar6 == 0) {
          nni_msg_trim(m,4);
          bVar8 = bVar1 >> 6 & 0xfe;
        }
      }
    }
  } while (bVar8 == 0);
  if (bVar8 == 4) {
    nni_msg_free(m);
    nni_pipe_recv(*arg,aio);
    return;
  }
  if (bVar8 != 2) {
    return;
  }
  nni_aio_set_msg((nni_aio *)((long)arg + 0x570),m);
  nni_msgq_aio_put(*(nni_msgq **)(lVar2 + 8),(nni_aio *)((long)arg + 0x570));
  return;
}

Assistant:

static void
xrep0_pipe_recv_cb(void *arg)
{
	xrep0_pipe *p = arg;
	xrep0_sock *s = p->rep;
	nni_msg    *msg;
	int         hops;
	int         ttl;

	if (nni_aio_result(&p->aio_recv) != 0) {
		nni_pipe_close(p->pipe);
		return;
	}

	ttl = nni_atomic_get(&s->ttl);

	msg = nni_aio_get_msg(&p->aio_recv);
	nni_aio_set_msg(&p->aio_recv, NULL);

	nni_msg_set_pipe(msg, nni_pipe_id(p->pipe));

	// Store the pipe id in the header, first thing.
	nni_msg_header_append_u32(msg, nni_pipe_id(p->pipe));

	// Move backtrace from body to header
	hops = 1;
	for (;;) {
		bool     end;
		uint8_t *body;
		if (hops > ttl) {
			// This isn't malformed, but it has gone through
			// too many hops.  Do not disconnect, because we
			// can legitimately receive messages with too many
			// hops from devices, etc.
			goto drop;
		}
		hops++;
		if (nni_msg_len(msg) < 4) {
			// Peer is speaking garbage. Kick it.
			nni_msg_free(msg);
			nni_pipe_close(p->pipe);
			return;
		}
		body = nni_msg_body(msg);
		end  = ((body[0] & 0x80u) != 0);
		if (nni_msg_header_append(msg, body, 4) != 0) {
			// Out of memory most likely, but keep going to
			// avoid breaking things.
			goto drop;
		}
		nni_msg_trim(msg, 4);
		if (end) {
			break;
		}
	}

	// Go ahead and send it up.
	nni_aio_set_msg(&p->aio_putq, msg);
	nni_msgq_aio_put(s->urq, &p->aio_putq);
	return;

drop:
	nni_msg_free(msg);
	nni_pipe_recv(p->pipe, &p->aio_recv);
}